

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O0

void qt_fusion_draw_mdibutton
               (QPainter *painter,QStyleOptionTitleBar *option,QRect *tmp,bool hover,bool sunken)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  QColor *pQVar6;
  byte in_CL;
  long in_RSI;
  QPen *in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  bool active;
  QLinearGradient gradient;
  QColor mdiButtonGradientStopColor;
  QColor mdiButtonGradientStartColor;
  QColor mdiButtonBorderColor;
  QColor titleBarHighlight;
  QColor highlight;
  QColor dark;
  QPoint points [4];
  QLine lines [4];
  double dVar7;
  QPoint *this;
  double dVar8;
  QLine *this_00;
  QPainter *this_01;
  int in_stack_fffffffffffffc70;
  int in_stack_fffffffffffffc74;
  int in_stack_fffffffffffffc78;
  int in_stack_fffffffffffffc7c;
  QColor *in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc8c;
  QBrush local_1e8 [8];
  QPen local_1e0 [8];
  QPoint local_1d8;
  QPoint local_1d0;
  undefined1 *local_1c8;
  Data *pDStack_1c0;
  pair<double,_QColor> *local_1b8;
  undefined1 *puStack_1b0;
  QGradientData local_1a8;
  undefined1 *local_178;
  QRect local_168;
  undefined1 local_158 [16];
  QRect local_148;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  int local_f8 [3];
  int local_ec;
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  QLine local_d8 [2];
  undefined8 local_b8;
  undefined4 local_b0;
  undefined2 local_ac;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(uint *)(in_RSI + 0x68);
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  QPalette::button((QPalette *)0x4f331e);
  QBrush::color((QBrush *)0x4f3326);
  iVar2 = QColor::hue();
  local_ec = 0xff;
  QPalette::button((QPalette *)0x4f3351);
  QBrush::color((QBrush *)0x4f3359);
  local_f8[2] = QColor::saturation();
  piVar5 = qMin<int>(&local_ec,local_f8 + 2);
  iVar4 = *piVar5;
  local_f8[1] = 0xff;
  QPalette::button((QPalette *)0x4f33a2);
  QBrush::color((QBrush *)0x4f33aa);
  iVar3 = QColor::value();
  local_f8[0] = (int)((double)iVar3 * 0.7);
  piVar5 = qMin<int>(local_f8 + 1,local_f8);
  local_108 = QColor::fromHsv(iVar2,iVar4,*piVar5,0xff);
  local_78 = local_108._0_8_;
  puStack_70._0_6_ = local_108._8_6_;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  local_80 = &DAT_aaaaaaaaaaaaaaaa;
  QPalette::highlight((QPalette *)0x4f3469);
  pQVar6 = QBrush::color((QBrush *)0x4f3471);
  local_88 = *(undefined1 **)pQVar6;
  local_80 = *(undefined1 **)((long)&pQVar6->ct + 4);
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  local_90 = &DAT_aaaaaaaaaaaaaaaa;
  if ((in_R8B & 1) == 0) {
    QColor::QColor(in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78,
                   in_stack_fffffffffffffc74,in_stack_fffffffffffffc70);
  }
  else {
    local_118 = QColor::darker((int)&local_88);
    local_98 = local_118._0_8_;
    local_90._0_6_ = local_118._8_6_;
  }
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  local_a0 = &DAT_aaaaaaaaaaaaaaaa;
  if ((uVar1 & 0x10000) == 0) {
    local_138 = QColor::darker((int)&local_78);
    local_a8 = local_138._0_8_;
    local_a0._0_6_ = local_138._8_6_;
  }
  else {
    local_128 = QColor::darker((int)&local_88);
    local_a8 = local_128._0_8_;
    local_a0._0_6_ = local_128._8_6_;
  }
  iVar4 = (int)((ulong)in_stack_fffffffffffffc80 >> 0x20);
  if ((in_R8B & 1) == 0) {
    if ((in_CL & 1) != 0) {
      local_168 = QRect::adjusted((QRect *)CONCAT44(in_stack_fffffffffffffc8c,
                                                    in_stack_fffffffffffffc88),iVar4,
                                  (int)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,
                                  in_stack_fffffffffffffc78);
      QColor::QColor(in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78,
                     in_stack_fffffffffffffc74,in_stack_fffffffffffffc70);
      QPainter::fillRect((QRect *)in_RDI,(QColor *)&local_168);
    }
  }
  else {
    local_148 = QRect::adjusted((QRect *)CONCAT44(in_stack_fffffffffffffc8c,
                                                  in_stack_fffffffffffffc88),iVar4,
                                (int)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,
                                in_stack_fffffffffffffc78);
    local_158 = QColor::darker((int)&local_88);
    local_b8 = local_158._0_8_;
    local_b0 = local_158._8_4_;
    local_ac = local_158._12_2_;
    QPainter::fillRect((QRect *)in_RDI,(QColor *)&local_148);
  }
  local_d8[0].pt1 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  local_d8[0].pt2 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = local_d8;
  QColor::QColor(in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78,
                 in_stack_fffffffffffffc74,in_stack_fffffffffffffc70);
  local_e8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
  this_01 = (QPainter *)&local_e8;
  QColor::QColor(in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78,
                 in_stack_fffffffffffffc74,in_stack_fffffffffffffc70);
  local_178 = &DAT_aaaaaaaaaaaaaaaa;
  local_1a8.radial.cradius = -NAN;
  local_1a8.radial.fradius = -NAN;
  local_1a8.linear.x2 = -NAN;
  local_1a8.linear.y2 = -NAN;
  local_1a8.linear.x1 = -NAN;
  local_1a8.linear.y1 = -NAN;
  local_1b8 = (pair<double,_QColor> *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_1b0 = &DAT_aaaaaaaaaaaaaaaa;
  local_1c8 = &DAT_aaaaaaaaaaaaaaaa;
  pDStack_1c0 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_1d0 = QRect::center((QRect *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  iVar4 = QPoint::x((QPoint *)0x4f3803);
  dVar7 = (double)iVar4;
  iVar4 = QRect::top((QRect *)0x4f3819);
  this = (QPoint *)(double)iVar4;
  local_1d8 = QRect::center((QRect *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  iVar4 = QPoint::x((QPoint *)0x4f3845);
  dVar8 = (double)iVar4;
  iVar4 = QRect::bottom((QRect *)0x4f385c);
  QLinearGradient::QLinearGradient
            ((QLinearGradient *)&local_1c8,dVar7,(double)this,dVar8,(double)iVar4);
  QGradient::setColorAt(0.0,(QColor *)&local_1c8);
  QGradient::setColorAt(1.0,(QColor *)&local_1c8);
  QPainter::setPen((QColor *)in_RDI);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QRect::left((QRect *)0x4f392e);
  QRect::top((QRect *)0x4f3942);
  QRect::right((QRect *)0x4f3953);
  QRect::top((QRect *)0x4f3967);
  QLine::QLine(this_00,(int)((ulong)dVar8 >> 0x20),SUB84(dVar8,0),(int)((ulong)this >> 0x20),
               (int)this);
  QRect::left((QRect *)0x4f3998);
  QRect::bottom((QRect *)0x4f39ac);
  QRect::right((QRect *)0x4f39bd);
  QRect::bottom((QRect *)0x4f39d1);
  QLine::QLine(this_00,(int)((ulong)dVar8 >> 0x20),SUB84(dVar8,0),(int)((ulong)this >> 0x20),
               (int)this);
  QRect::left((QRect *)0x4f39f7);
  QRect::top((QRect *)0x4f3a08);
  QRect::left((QRect *)0x4f3a1c);
  QRect::bottom((QRect *)0x4f3a2d);
  QLine::QLine(this_00,(int)((ulong)dVar8 >> 0x20),SUB84(dVar8,0),(int)((ulong)this >> 0x20),
               (int)this);
  QRect::right((QRect *)0x4f3a57);
  QRect::top((QRect *)0x4f3a68);
  QRect::right((QRect *)0x4f3a7c);
  QRect::bottom((QRect *)0x4f3a8d);
  QLine::QLine(this_00,(int)((ulong)dVar8 >> 0x20),SUB84(dVar8,0),(int)((ulong)this >> 0x20),
               (int)this);
  QPainter::drawLines((QLine *)in_RDI,(int)&local_48);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QRect::left((QRect *)0x4f3b06);
  QRect::top((QRect *)0x4f3b1c);
  QPoint::QPoint(this,(int)((ulong)dVar7 >> 0x20),SUB84(dVar7,0));
  QRect::right((QRect *)0x4f3b59);
  QRect::top((QRect *)0x4f3b6f);
  QPoint::QPoint(this,(int)((ulong)dVar7 >> 0x20),SUB84(dVar7,0));
  QRect::left((QRect *)0x4f3b94);
  QRect::bottom((QRect *)0x4f3baa);
  QPoint::QPoint(this,(int)((ulong)dVar7 >> 0x20),SUB84(dVar7,0));
  QRect::right((QRect *)0x4f3bdf);
  QRect::bottom((QRect *)0x4f3bf5);
  QPoint::QPoint(this,(int)((ulong)dVar7 >> 0x20),SUB84(dVar7,0));
  QPainter::drawPoints((QPoint *)in_RDI,(int)&local_68);
  QPainter::setPen((QColor *)in_RDI);
  QRect::left((QRect *)0x4f3c5b);
  QRect::top((QRect *)0x4f3c72);
  QRect::right((QRect *)0x4f3c88);
  QRect::top((QRect *)0x4f3c9f);
  QPainter::drawLine(this_01,(int)((ulong)this_00 >> 0x20),(int)this_00,(int)((ulong)dVar8 >> 0x20),
                     SUB84(dVar8,0));
  QRect::left((QRect *)0x4f3ce4);
  QRect::top((QRect *)0x4f3cfa);
  QRect::left((QRect *)0x4f3d11);
  QRect::bottom((QRect *)0x4f3d27);
  QPainter::drawLine(this_01,(int)((ulong)this_00 >> 0x20),(int)this_00,(int)((ulong)dVar8 >> 0x20),
                     SUB84(dVar8,0));
  QBrush::QBrush(local_1e8,(QGradient *)&local_1c8);
  QPen::QPen(local_1e0,local_1e8,1.0,SolidLine,SquareCap,BevelJoin);
  QPainter::setPen(in_RDI);
  QPen::~QPen(local_1e0);
  QBrush::~QBrush(local_1e8);
  QRect::right((QRect *)0x4f3dff);
  QRect::top((QRect *)0x4f3e15);
  QRect::right((QRect *)0x4f3e2c);
  QRect::bottom((QRect *)0x4f3e42);
  QPainter::drawLine(this_01,(int)((ulong)this_00 >> 0x20),(int)this_00,(int)((ulong)dVar8 >> 0x20),
                     SUB84(dVar8,0));
  QRect::right((QRect *)0x4f3e88);
  QRect::top((QRect *)0x4f3e9c);
  QPainter::drawPoint((QPainter *)this_00,(int)((ulong)dVar8 >> 0x20),SUB84(dVar8,0));
  QRect::left((QRect *)0x4f3ed1);
  QRect::bottom((QRect *)0x4f3ee8);
  QRect::right((QRect *)0x4f3efe);
  QRect::bottom((QRect *)0x4f3f15);
  QPainter::drawLine(this_01,(int)((ulong)this_00 >> 0x20),(int)this_00,(int)((ulong)dVar8 >> 0x20),
                     SUB84(dVar8,0));
  QRect::left((QRect *)0x4f3f5a);
  QRect::bottom((QRect *)0x4f3f70);
  QPainter::drawPoint((QPainter *)this_00,(int)((ulong)dVar8 >> 0x20),SUB84(dVar8,0));
  QRect::right((QRect *)0x4f3fa3);
  QRect::bottom((QRect *)0x4f3fb9);
  QPainter::drawPoint((QPainter *)this_00,(int)((ulong)dVar8 >> 0x20),SUB84(dVar8,0));
  QRect::right((QRect *)0x4f3fec);
  QRect::bottom((QRect *)0x4f4000);
  QPainter::drawPoint((QPainter *)this_00,(int)((ulong)dVar8 >> 0x20),SUB84(dVar8,0));
  QLinearGradient::~QLinearGradient((QLinearGradient *)&local_1c8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void qt_fusion_draw_mdibutton(QPainter *painter, const QStyleOptionTitleBar *option, const QRect &tmp, bool hover, bool sunken)
{
    bool active = (option->titleBarState & QStyle::State_Active);
    const QColor dark = QColor::fromHsv(option->palette.button().color().hue(),
                                        qMin(255, option->palette.button().color().saturation()),
                                        qMin(255, int(option->palette.button().color().value() * 0.7)));
    const QColor highlight = option->palette.highlight().color();
    const QColor titleBarHighlight(sunken ? highlight.darker(130) : QColor(255, 255, 255, 60));
    const QColor mdiButtonBorderColor(active ? highlight.darker(180): dark.darker(110));

    if (sunken)
        painter->fillRect(tmp.adjusted(1, 1, -1, -1), highlight.darker(120));
    else if (hover)
        painter->fillRect(tmp.adjusted(1, 1, -1, -1), QColor(255, 255, 255, 20));

    const QColor mdiButtonGradientStartColor(0, 0, 0, 40);
    const QColor mdiButtonGradientStopColor(255, 255, 255, 60);

    QLinearGradient gradient(tmp.center().x(), tmp.top(), tmp.center().x(), tmp.bottom());
    gradient.setColorAt(0, mdiButtonGradientStartColor);
    gradient.setColorAt(1, mdiButtonGradientStopColor);

    painter->setPen(mdiButtonBorderColor);
    const QLine lines[4] = {
        QLine(tmp.left() + 2, tmp.top(), tmp.right() - 2, tmp.top()),
        QLine(tmp.left() + 2, tmp.bottom(), tmp.right() - 2, tmp.bottom()),
        QLine(tmp.left(), tmp.top() + 2, tmp.left(), tmp.bottom() - 2),
        QLine(tmp.right(), tmp.top() + 2, tmp.right(), tmp.bottom() - 2)
    };
    painter->drawLines(lines, 4);
    const QPoint points[4] = {
        QPoint(tmp.left() + 1, tmp.top() + 1),
        QPoint(tmp.right() - 1, tmp.top() + 1),
        QPoint(tmp.left() + 1, tmp.bottom() - 1),
        QPoint(tmp.right() - 1, tmp.bottom() - 1)
    };
    painter->drawPoints(points, 4);

    painter->setPen(titleBarHighlight);
    painter->drawLine(tmp.left() + 2, tmp.top() + 1, tmp.right() - 2, tmp.top() + 1);
    painter->drawLine(tmp.left() + 1, tmp.top() + 2, tmp.left() + 1, tmp.bottom() - 2);

    painter->setPen(QPen(gradient, 1));
    painter->drawLine(tmp.right() + 1, tmp.top() + 2, tmp.right() + 1, tmp.bottom() - 2);
    painter->drawPoint(tmp.right() , tmp.top() + 1);

    painter->drawLine(tmp.left() + 2, tmp.bottom() + 1, tmp.right() - 2, tmp.bottom() + 1);
    painter->drawPoint(tmp.left() + 1, tmp.bottom());
    painter->drawPoint(tmp.right() - 1, tmp.bottom());
    painter->drawPoint(tmp.right() , tmp.bottom() - 1);
}